

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O0

HashBlock *
compress(HashBlock *__return_storage_ptr__,
        vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
        *m)

{
  _WordT _Var1;
  ulong uVar2;
  size_type sVar3;
  reference __x;
  unsigned_long uVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  reference this;
  bitset<32ul> local_568 [32];
  bitset<32ul> local_548 [32];
  bitset<32ul> local_528 [32];
  bitset<32ul> local_508 [32];
  bitset<32ul> local_4e8 [32];
  bitset<32ul> local_4c8 [32];
  bitset<32ul> local_4a8 [32];
  bitset<32ul> local_488 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8 [32];
  _Base_bitset<1UL> local_388;
  _Base_bitset<1UL> local_380;
  _Base_bitset<1UL> local_378;
  _Base_bitset<1UL> local_370;
  _Base_bitset<1UL> local_368;
  _Base_bitset<1UL> local_360;
  _Base_bitset<1UL> local_358;
  _Base_bitset<1UL> local_350;
  ExpansionBlock local_348;
  ExpansionBlock local_340;
  ExpansionBlock local_338;
  _Base_bitset<1UL> local_330;
  ExpansionBlock local_328;
  _Base_bitset<1UL> local_320;
  long local_318;
  Prime t2;
  _Base_bitset<1UL> local_308;
  ExpansionBlock local_300;
  ExpansionBlock local_2f8;
  ExpansionBlock local_2f0;
  _Base_bitset<1UL> local_2e8;
  ExpansionBlock local_2e0;
  _Base_bitset<1UL> local_2d8;
  long local_2d0;
  Prime t1;
  int j;
  undefined1 local_2b8 [8];
  ExpansionBlockVec mi;
  _Base_bitset<1UL> _Stack_298;
  int i;
  HashBlockSegment hs [8];
  Prime ks [64];
  unsigned_long local_50;
  Prime h;
  Prime g;
  Prime f;
  Prime e;
  Prime d;
  Prime c;
  Prime b;
  Prime a;
  vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
  *m_local;
  
  memcpy(hs + 7,&DAT_0010b0a0,0x200);
  memcpy(&stack0xfffffffffffffd68,&DAT_0010b2a0,0x40);
  mi.super__Vector_base<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  while( true ) {
    uVar2 = (ulong)mi.super__Vector_base<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    sVar3 = std::
            vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
            ::size(m);
    if (sVar3 <= uVar2) break;
    __x = std::
          vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
          ::operator[](m,(long)mi.
                               super__Vector_base<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>::vector
              ((vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_> *)local_2b8,__x);
    b = std::bitset<32UL>::to_ulong((bitset<32UL> *)&stack0xfffffffffffffd68);
    c = std::bitset<32UL>::to_ulong(hs);
    d = std::bitset<32UL>::to_ulong(hs + 1);
    e = std::bitset<32UL>::to_ulong(hs + 2);
    f = std::bitset<32UL>::to_ulong(hs + 3);
    g = std::bitset<32UL>::to_ulong(hs + 4);
    h = std::bitset<32UL>::to_ulong(hs + 5);
    local_50 = std::bitset<32UL>::to_ulong(hs + 6);
    for (t1._0_4_ = 0; (int)t1 < 0x40; t1._0_4_ = (int)t1 + 1) {
      std::bitset<32UL>::bitset(&local_2e0,b);
      local_2d8._M_w = (_WordT)big_sigma0(local_2e0);
      uVar4 = std::bitset<32UL>::to_ulong((bitset<32UL> *)&local_2d8);
      std::bitset<32UL>::bitset(&local_2f0,b);
      std::bitset<32UL>::bitset(&local_2f8,c);
      std::bitset<32UL>::bitset(&local_300,d);
      local_2e8._M_w = (_WordT)maj(local_2f0,local_2f8,local_300);
      uVar5 = std::bitset<32UL>::to_ulong((bitset<32UL> *)&local_2e8);
      std::bitset<32UL>::bitset((bitset<32UL> *)&t2,d + e);
      local_308._M_w = (_WordT)big_sigma2((ExpansionBlock)t2);
      uVar6 = std::bitset<32UL>::to_ulong((bitset<32UL> *)&local_308);
      local_2d0 = uVar4 + uVar5 + uVar6;
      std::bitset<32UL>::bitset(&local_328,f);
      local_320._M_w = (_WordT)big_sigma1(local_328);
      uVar4 = std::bitset<32UL>::to_ulong((bitset<32UL> *)&local_320);
      std::bitset<32UL>::bitset(&local_338,f);
      std::bitset<32UL>::bitset(&local_340,g);
      std::bitset<32UL>::bitset(&local_348,h);
      local_330._M_w = (_WordT)ch(local_338,local_340,local_348);
      uVar5 = std::bitset<32UL>::to_ulong((bitset<32UL> *)&local_330);
      _Var1 = hs[(long)(int)t1 + 7].super__Base_bitset<1UL>._M_w;
      this = std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>::operator[]
                       ((vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_> *)local_2b8,
                        (long)(int)t1);
      uVar6 = std::bitset<32UL>::to_ulong(this);
      local_318 = local_50 + uVar4 + uVar5 + _Var1 + uVar6;
      local_50 = h;
      g = f;
      e = d;
      c = b;
      h = f;
      f = d + local_2d0;
      d = b;
      b = local_2d0 * 3 - local_318;
    }
    uVar4 = std::bitset<32UL>::to_ulong((bitset<32UL> *)&stack0xfffffffffffffd68);
    std::bitset<32UL>::bitset((bitset<32UL> *)&local_350,b + uVar4);
    _Stack_298._M_w = local_350._M_w;
    uVar4 = std::bitset<32UL>::to_ulong(hs);
    std::bitset<32UL>::bitset((bitset<32UL> *)&local_358,c + uVar4);
    hs[0].super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(_Base_bitset<1UL>)local_358._M_w;
    uVar4 = std::bitset<32UL>::to_ulong(hs + 1);
    std::bitset<32UL>::bitset((bitset<32UL> *)&local_360,d + uVar4);
    hs[1].super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(_Base_bitset<1UL>)local_360._M_w;
    uVar4 = std::bitset<32UL>::to_ulong(hs + 2);
    std::bitset<32UL>::bitset((bitset<32UL> *)&local_368,e + uVar4);
    hs[2].super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(_Base_bitset<1UL>)local_368._M_w;
    uVar4 = std::bitset<32UL>::to_ulong(hs + 3);
    std::bitset<32UL>::bitset((bitset<32UL> *)&local_370,f + uVar4);
    hs[3].super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(_Base_bitset<1UL>)local_370._M_w;
    uVar4 = std::bitset<32UL>::to_ulong(hs + 4);
    std::bitset<32UL>::bitset((bitset<32UL> *)&local_378,g + uVar4);
    hs[4].super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(_Base_bitset<1UL>)local_378._M_w;
    uVar4 = std::bitset<32UL>::to_ulong(hs + 5);
    std::bitset<32UL>::bitset((bitset<32UL> *)&local_380,h + uVar4);
    hs[5].super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(_Base_bitset<1UL>)local_380._M_w;
    uVar4 = std::bitset<32UL>::to_ulong(hs + 6);
    std::bitset<32UL>::bitset((bitset<32UL> *)&local_388,local_50 + uVar4);
    hs[6].super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(_Base_bitset<1UL>)local_388._M_w;
    std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>::~vector
              ((vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_> *)local_2b8);
    mi.super__Vector_base<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         mi.super__Vector_base<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  std::bitset<32ul>::to_string_abi_cxx11_(local_488);
  std::bitset<32ul>::to_string_abi_cxx11_(local_4a8);
  std::operator+(local_468,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488);
  std::bitset<32ul>::to_string_abi_cxx11_(local_4c8);
  std::operator+(local_448,local_468);
  std::bitset<32ul>::to_string_abi_cxx11_(local_4e8);
  std::operator+(local_428,local_448);
  std::bitset<32ul>::to_string_abi_cxx11_(local_508);
  std::operator+(local_408,local_428);
  std::bitset<32ul>::to_string_abi_cxx11_(local_528);
  std::operator+(local_3e8,local_408);
  std::bitset<32ul>::to_string_abi_cxx11_(local_548);
  std::operator+(local_3c8,local_3e8);
  std::bitset<32ul>::to_string_abi_cxx11_(local_568);
  std::operator+(local_3a8,local_3c8);
  std::bitset<256ul>::bitset<char,std::char_traits<char>,std::allocator<char>>
            ((bitset<256ul> *)__return_storage_ptr__,local_3a8,0);
  std::__cxx11::string::~string((string *)local_3a8);
  std::__cxx11::string::~string((string *)local_568);
  std::__cxx11::string::~string((string *)local_3c8);
  std::__cxx11::string::~string((string *)local_548);
  std::__cxx11::string::~string((string *)local_3e8);
  std::__cxx11::string::~string((string *)local_528);
  std::__cxx11::string::~string((string *)local_408);
  std::__cxx11::string::~string((string *)local_508);
  std::__cxx11::string::~string((string *)local_428);
  std::__cxx11::string::~string((string *)local_4e8);
  std::__cxx11::string::~string((string *)local_448);
  std::__cxx11::string::~string((string *)local_4c8);
  std::__cxx11::string::~string((string *)local_468);
  std::__cxx11::string::~string((string *)local_4a8);
  std::__cxx11::string::~string((string *)local_488);
  return __return_storage_ptr__;
}

Assistant:

HashBlock compress(std::vector<ExpansionBlockVec> m)
{

    Prime a, b, c, d, e, f, g, h;

    Prime ks[] = {
            0x428a2f98,         // K0
            0x71374491,         // K1
            0xb5c0fbcf,         // K2
            0xe9b5dba5,         // K3
            0x3956c25b,         // K4
            0x59f111f1,         // K5
            0x923f82a4,         // K6
            0xab1c5ed5,         // K7
            0xd807aa98,         // K8
            0x12835b01,         // K9
            0x243185be,         // K10
            0x550c7dc3,         // K11
            0x72be5d74,         // K12
            0x80deb1fe,         // K13
            0x9bdc06a7,         // K14
            0xc19bf174,         // K15
            0xe49b69c1,         // K16
            0xefbe4786,         // K17
            0x0fc19dc6,         // K18
            0x240ca1cc,         // K19
            0x2de92c6f,         // K20
            0x4a7484aa,         // K21
            0x5cb0a9dc,         // K22
            0x76f988da,         // K23
            0x983e5152,         // K24
            0xa831c66d,         // K25
            0xb00327c8,         // K26
            0xbf597fc7,         // K27
            0xc6e00bf3,         // K28
            0xd5a79147,         // K29
            0x06ca6351,         // K30
            0x14292967,         // K31
            0x27b70a85,         // K32
            0x2e1b2138,         // K33
            0x4d2c6dfc,         // K34
            0x53380d13,         // K35
            0x650a7354,         // K36
            0x766a0abb,         // K37
            0x81c2c92e,         // K38
            0x92722c85,         // K39
            0xa2bfe8a1,         // K40
            0xa81a664b,         // K41
            0xc24b8b70,         // K42
            0xc76c51a3,         // K43
            0xd192e819,         // K44
            0xd6990624,         // K45
            0xf40e3585,         // K46
            0x106aa070,         // K47
            0x19a4c116,         // K48
            0x1e376c08,         // K49
            0x2748774c,         // K50
            0x34b0bcb5,         // K51
            0x391c0cb3,         // K52
            0x4ed8aa4a,         // K53
            0x5b9cca4f,         // K54
            0x682e6ff3,         // K55
            0x748f82ee,         // K56
            0x78a5636f,         // K57
            0x84c87814,         // K58
            0x8cc70208,         // K59
            0x90befffa,         // K60
            0xa4506ceb,         // K61
            0xbe49a3f7,         // K62
            0xc67178f2,         // K63
    };
    HashBlockSegment hs[] = {
            0x6a09e667,         // H(0, 0)
            0xbb67ae85,         // H(0, 1)
            0x3c6ef372,         // H(0, 2)
            0xa54ff53a,         // H(0, 3)
            0x510e527f,         // H(0, 4)
            0x9b05688c,         // H(0, 5)
            0x1f83d9ab,         // H(0, 6)
            0x5be0cd19          // H(0, 7)
    };


    // Iterate over all expansion blocks
    for (int i = 0; i < m.size(); ++i)
    {
        ExpansionBlockVec mi = m[i];
        a = hs[0].to_ulong();
        b = hs[1].to_ulong();
        c = hs[2].to_ulong();
        d = hs[3].to_ulong();
        e = hs[4].to_ulong();
        f = hs[5].to_ulong();
        g = hs[6].to_ulong();
        h = hs[7].to_ulong();

        for (int j = 0; j < EXPANSION_BLOCK_COUNT_IN_SET; ++j)
        {
            Prime t1 = big_sigma0(a).to_ulong() + maj(a, b, c).to_ulong() + big_sigma2(c + d).to_ulong();
            Prime t2 = h + big_sigma1(e).to_ulong() + ch(e, f, g).to_ulong() + ks[j] + mi[j].to_ulong();

            h = g;
            f = e;
            d = c;
            b = a;
            g = f;
            e = d + t1;
            c = b;
            a = 3 * t1 - t2;
        }

        hs[0] = a + hs[0].to_ulong();
        hs[1] = b + hs[1].to_ulong();
        hs[2] = c + hs[2].to_ulong();
        hs[3] = d + hs[3].to_ulong();
        hs[4] = e + hs[4].to_ulong();
        hs[5] = f + hs[5].to_ulong();
        hs[6] = g + hs[6].to_ulong();
        hs[7] = h + hs[7].to_ulong();
    }
    HashBlock result(
            hs[0].to_string() +
            hs[1].to_string() +
            hs[2].to_string() +
            hs[3].to_string() +
            hs[4].to_string() +
            hs[5].to_string() +
            hs[6].to_string() +
            hs[7].to_string()
    );

    return result;
}